

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O3

uint SOIL_internal_create_OGL_texture
               (uchar *data,int width,int height,int channels,uint reuse_texture_ID,uint flags,
               uint opengl_texture_type,uint opengl_texture_target,uint texture_check_size_enum)

{
  uchar uVar1;
  byte bVar2;
  int iVar3;
  uchar *puVar4;
  undefined8 extraout_RAX;
  int iVar5;
  ulong uVar6;
  undefined8 uVar7;
  GLint GVar8;
  undefined8 uVar9;
  int iVar10;
  uint uVar11;
  uchar *puVar12;
  int iVar13;
  uint uVar14;
  int iVar16;
  bool bVar17;
  uint local_80;
  GLenum local_7c;
  uint local_70;
  int DDS_size;
  GLenum local_68;
  uint tex_id;
  uchar *local_60;
  ulong local_58;
  ulong local_50;
  int max_supported_size;
  ulong local_40;
  int local_34;
  ulong uVar15;
  
  local_58 = CONCAT44(local_58._4_4_,reuse_texture_ID);
  local_7c = opengl_texture_target;
  local_70 = opengl_texture_type;
  if ((flags >> 9 & 1) == 0) {
    local_80 = flags;
  }
  else {
    iVar16 = query_tex_rectangle_capability();
    if (iVar16 != 1) {
      result_string_pointer = "Texture Rectangle extension unsupported";
      return 0;
    }
    if (opengl_texture_type == 0xde1) {
      local_80 = flags & 0xfffffff8;
      local_7c = 0x84f5;
      local_70 = 0x84f5;
    }
    else {
      local_80 = flags & 0xfffffdff;
    }
  }
  iVar16 = channels * width;
  puVar4 = (uchar *)malloc((long)(iVar16 * height));
  memcpy(puVar4,data,(long)(iVar16 * height));
  if (0 < height && (local_80 & 0x10) != 0) {
    iVar5 = iVar16 * (height - 1U);
    iVar10 = 0;
    uVar14 = 0;
    do {
      if (0 < iVar16) {
        puVar12 = puVar4;
        uVar11 = iVar16 + 1;
        do {
          uVar1 = puVar12[iVar10];
          puVar12[iVar10] = puVar12[iVar5];
          puVar12[iVar5] = uVar1;
          puVar12 = puVar12 + 1;
          uVar11 = uVar11 - 1;
        } while (1 < uVar11);
      }
      iVar5 = iVar5 - iVar16;
      iVar10 = iVar10 + iVar16;
      bVar17 = uVar14 != height - 1U >> 1;
      uVar14 = uVar14 + 1;
    } while (bVar17);
  }
  if ((char)local_80 < '\0') {
    scale_image_RGB_to_NTSC_safe(puVar4,width,height,channels);
  }
  if ((local_80 & 8) != 0) {
    if (channels == 2) {
      uVar14 = width * height * 2;
      if (0 < (int)uVar14) {
        uVar6 = 0;
        do {
          puVar4[uVar6] = (uchar)((uint)puVar4[uVar6 + 1] * (uint)puVar4[uVar6] + 0x80 >> 8);
          uVar6 = uVar6 + 2;
        } while (uVar6 < uVar14);
      }
    }
    else if ((channels == 4) && (0 < width * height * 4)) {
      uVar6 = 0;
      do {
        bVar2 = puVar4[uVar6 + 3];
        puVar4[uVar6] = (uchar)((uint)puVar4[uVar6] * (uint)bVar2 + 0x80 >> 8);
        puVar4[uVar6 + 1] = (uchar)((uint)puVar4[uVar6 + 1] * (uint)bVar2 + 0x80 >> 8);
        puVar4[uVar6 + 2] = (uchar)((uint)puVar4[uVar6 + 2] * (uint)bVar2 + 0x80 >> 8);
        uVar6 = uVar6 + 4;
      } while (uVar6 < (uint)(width * height * 4));
    }
  }
  iVar16 = query_NPOT_capability();
  glGetIntegerv(texture_check_size_enum,&max_supported_size);
  if (((local_80 & 3) != 0 || (local_80 & 0x200) == 0 && iVar16 == 0) ||
     (max_supported_size < width || max_supported_size < height)) {
    iVar16 = 1;
    do {
      iVar5 = iVar16;
      iVar16 = iVar5 * 2;
    } while (iVar5 < width);
    uVar14 = 1;
    do {
      uVar11 = uVar14;
      uVar6 = (ulong)uVar11;
      uVar14 = uVar11 * 2;
    } while ((int)uVar11 < height);
    if (uVar11 != height || iVar5 != width) {
      puVar12 = (uchar *)malloc((long)(int)(iVar5 * channels * uVar11));
      up_scale_image(puVar4,width,height,channels,puVar12,iVar5,uVar11);
      free(puVar4);
      goto LAB_0014639c;
    }
  }
  uVar6 = (ulong)(uint)height;
  puVar12 = puVar4;
  iVar5 = width;
LAB_0014639c:
  iVar10 = (int)uVar6;
  puVar4 = puVar12;
  iVar16 = iVar5;
  if (max_supported_size < iVar5 || max_supported_size < iVar10) {
    local_40 = 1;
    iVar13 = 1;
    if (max_supported_size < iVar5) {
      iVar13 = iVar5 / max_supported_size;
    }
    if (max_supported_size < iVar10) {
      local_40 = (long)iVar10 / (long)max_supported_size & 0xffffffff;
    }
    iVar16 = iVar5 / iVar13;
    iVar3 = iVar10 / (int)local_40;
    local_60 = (uchar *)CONCAT44(local_60._4_4_,iVar3);
    puVar4 = (uchar *)malloc((long)(iVar16 * channels * iVar3));
    mipmap_image(puVar12,iVar5,iVar10,channels,puVar4,iVar13,(int)local_40);
    free(puVar12);
    uVar6 = (ulong)local_60 & 0xffffffff;
  }
  iVar5 = (int)uVar6;
  if ((local_80 >> 8 & 1) != 0) {
    convert_RGB_to_YCoCg(puVar4,iVar16,iVar5,channels);
  }
  tex_id = (uint)local_58;
  if (((uint)local_58 == 0) && (glGenTextures(1,&tex_id), tex_id == 0)) {
    result_string_pointer = "Failed to generate an OpenGL texture name; missing OpenGL context?";
  }
  else {
    local_50 = 0;
    if (channels - 1U < 4) {
      local_50 = (ulong)*(uint *)(&DAT_001850dc + (ulong)(channels - 1U) * 4);
    }
    if (((local_80 & 0x20) == 0) || (iVar10 = query_DXT_capability(), iVar10 != 1)) {
      glBindTexture(local_70,tex_id);
      uVar15 = local_50;
      local_40 = local_40 & 0xffffffff00000000;
      glTexImage2D(local_7c,0,local_50 & 0xffffffff,iVar16,uVar6,0,local_50,0x1401,puVar4);
    }
    else {
      glBindTexture(local_70);
      bVar17 = (channels & 1U) == 0;
      if (bVar17) {
        puVar12 = convert_image_to_DXT5(puVar4,iVar16,iVar5,channels,&DDS_size);
      }
      else {
        puVar12 = convert_image_to_DXT1(puVar4,iVar16,iVar5,channels,&DDS_size);
      }
      uVar14 = (uint)bVar17 * 3 + 0x83f0;
      uVar15 = (ulong)uVar14;
      if (puVar12 == (uchar *)0x0) {
        uVar9 = glTexImage2D(local_7c,0,uVar15,iVar16,uVar6,0,local_50,0x1401,puVar4);
      }
      else {
        (*soilGlCompressedTexImage2D)(local_7c,0,uVar14,iVar16,iVar5,0,DDS_size,puVar12);
        free(puVar12);
        uVar9 = extraout_RAX;
      }
      local_40 = CONCAT44(local_40._4_4_,(int)CONCAT71((int7)((ulong)uVar9 >> 8),1));
    }
    uVar9 = 0x2601;
    if ((local_80 & 2) != 0) {
      local_68 = (GLenum)uVar15;
      iVar10 = (iVar16 - (iVar16 + 1 >> 0x1f)) + 1 >> 1;
      iVar13 = (iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1;
      puVar12 = (uchar *)malloc((long)(iVar13 * channels * iVar10));
      local_34 = iVar5;
      if (iVar5 < iVar16) {
        local_34 = iVar16;
      }
      if (1 < local_34) {
        uVar6 = 1;
        iVar3 = 2;
        local_60 = puVar12;
        do {
          puVar12 = local_60;
          local_58 = uVar6;
          mipmap_image(puVar4,iVar16,iVar5,channels,local_60,iVar3,iVar3);
          if ((char)local_40 == '\0') {
            glTexImage2D(local_7c,local_58,local_68,iVar10,iVar13,0,local_50,0x1401,puVar12);
            GVar8 = (GLint)local_58;
          }
          else {
            if ((channels & 1U) == 0) {
              puVar12 = convert_image_to_DXT5(local_60,iVar10,iVar13,channels,&DDS_size);
            }
            else {
              puVar12 = convert_image_to_DXT1(local_60,iVar10,iVar13,channels,&DDS_size);
            }
            GVar8 = (GLint)local_58;
            if (puVar12 == (uchar *)0x0) {
              glTexImage2D(local_7c,local_58 & 0xffffffff,local_68,iVar10,iVar13,0,local_50,0x1401,
                           local_60);
            }
            else {
              (*soilGlCompressedTexImage2D)
                        (local_7c,GVar8,local_68,iVar10,iVar13,0,DDS_size,puVar12);
              free(puVar12);
            }
          }
          iVar10 = (iVar10 - (iVar10 + 1 >> 0x1f)) + 1 >> 1;
          iVar3 = 2 << ((byte)GVar8 & 0x1f);
          iVar13 = (iVar13 - (iVar13 + 1 >> 0x1f)) + 1 >> 1;
          uVar6 = (ulong)(GVar8 + 1);
          puVar12 = local_60;
        } while (iVar3 <= local_34);
      }
      free(puVar12);
      uVar9 = 0x2703;
    }
    glTexParameteri(local_70,0x2800,0x2601);
    glTexParameteri(local_70,0x2801,uVar9);
    if ((local_80 & 4) == 0) {
      uVar7 = 0x2900;
      glTexParameteri(local_70,0x2802,0x2900);
      uVar9 = 0x2900;
    }
    else {
      uVar7 = 0x2901;
      glTexParameteri(local_70,0x2802,0x2901);
      uVar9 = 0x2901;
    }
    glTexParameteri(local_70,0x2803,uVar9);
    if (local_70 == 0x8513) {
      glTexParameteri(0x8513,0x8072,uVar7);
    }
    result_string_pointer = "Image loaded as an OpenGL texture";
  }
  free(puVar4);
  return tex_id;
}

Assistant:

unsigned int
	SOIL_internal_create_OGL_texture
	(
		const unsigned char *const data,
		int width, int height, int channels,
		unsigned int reuse_texture_ID,
		unsigned int flags,
		unsigned int opengl_texture_type,
		unsigned int opengl_texture_target,
		unsigned int texture_check_size_enum
	)
{
	/*	variables	*/
	unsigned char* img;
	unsigned int tex_id;
	unsigned int internal_texture_format = 0, original_texture_format = 0;
	int DXT_mode = SOIL_CAPABILITY_UNKNOWN;
	int max_supported_size;
	/*	If the user wants to use the texture rectangle I kill a few flags	*/
	if( flags & SOIL_FLAG_TEXTURE_RECTANGLE )
	{
		/*	well, the user asked for it, can we do that?	*/
		if( query_tex_rectangle_capability() == SOIL_CAPABILITY_PRESENT )
		{
			/*	only allow this if the user in _NOT_ trying to do a cubemap!	*/
			if( opengl_texture_type == GL_TEXTURE_2D )
			{
				/*	clean out the flags that cannot be used with texture rectangles	*/
				flags &= ~(
						SOIL_FLAG_POWER_OF_TWO | SOIL_FLAG_MIPMAPS |
						SOIL_FLAG_TEXTURE_REPEATS
					);
				/*	and change my target	*/
				opengl_texture_target = SOIL_TEXTURE_RECTANGLE_ARB;
				opengl_texture_type = SOIL_TEXTURE_RECTANGLE_ARB;
			} else
			{
				/*	not allowed for any other uses (yes, I'm looking at you, cubemaps!)	*/
				flags &= ~SOIL_FLAG_TEXTURE_RECTANGLE;
			}

		} else
		{
			/*	can't do it, and that is a breakable offense (uv coords use pixels instead of [0,1]!)	*/
			result_string_pointer = "Texture Rectangle extension unsupported";
			return 0;
		}
	}
	/*	create a copy the image data	*/
	img = (unsigned char*)malloc( width*height*channels );
	memcpy( img, data, width*height*channels );
	/*	does the user want me to invert the image?	*/
	if( flags & SOIL_FLAG_INVERT_Y )
	{
		int i, j;
		for( j = 0; j*2 < height; ++j )
		{
			int index1 = j * width * channels;
			int index2 = (height - 1 - j) * width * channels;
			for( i = width * channels; i > 0; --i )
			{
				unsigned char temp = img[index1];
				img[index1] = img[index2];
				img[index2] = temp;
				++index1;
				++index2;
			}
		}
	}
	/*	does the user want me to scale the colors into the NTSC safe RGB range?	*/
	if( flags & SOIL_FLAG_NTSC_SAFE_RGB )
	{
		scale_image_RGB_to_NTSC_safe( img, width, height, channels );
	}
	/*	does the user want me to convert from straight to pre-multiplied alpha?
		(and do we even _have_ alpha?)	*/
	if( flags & SOIL_FLAG_MULTIPLY_ALPHA )
	{
		int i;
		switch( channels )
		{
		case 2:
			for( i = 0; i < 2*width*height; i += 2 )
			{
				img[i] = (img[i] * img[i+1] + 128) >> 8;
			}
			break;
		case 4:
			for( i = 0; i < 4*width*height; i += 4 )
			{
				img[i+0] = (img[i+0] * img[i+3] + 128) >> 8;
				img[i+1] = (img[i+1] * img[i+3] + 128) >> 8;
				img[i+2] = (img[i+2] * img[i+3] + 128) >> 8;
			}
			break;
		default:
			/*	no other number of channels contains alpha data	*/
			break;
		}
	}
	/*	if the user can't support NPOT textures, make sure we force the POT option	*/
	if( (query_NPOT_capability() == SOIL_CAPABILITY_NONE) &&
		!(flags & SOIL_FLAG_TEXTURE_RECTANGLE) )
	{
		/*	add in the POT flag */
		flags |= SOIL_FLAG_POWER_OF_TWO;
	}
	/*	how large of a texture can this OpenGL implementation handle?	*/
	/*	texture_check_size_enum will be GL_MAX_TEXTURE_SIZE or SOIL_MAX_CUBE_MAP_TEXTURE_SIZE	*/
	glGetIntegerv( texture_check_size_enum, &max_supported_size );
	/*	do I need to make it a power of 2?	*/
	if(
		(flags & SOIL_FLAG_POWER_OF_TWO) ||	/*	user asked for it	*/
		(flags & SOIL_FLAG_MIPMAPS) ||		/*	need it for the MIP-maps	*/
		(width > max_supported_size) ||		/*	it's too big, (make sure it's	*/
		(height > max_supported_size) )		/*	2^n for later down-sampling)	*/
	{
		int new_width = 1;
		int new_height = 1;
		while( new_width < width )
		{
			new_width *= 2;
		}
		while( new_height < height )
		{
			new_height *= 2;
		}
		/*	still?	*/
		if( (new_width != width) || (new_height != height) )
		{
			/*	yep, resize	*/
			unsigned char *resampled = (unsigned char*)malloc( channels*new_width*new_height );
			up_scale_image(
					img, width, height, channels,
					resampled, new_width, new_height );
			/*	OJO	this is for debug only!	*/
			/*
			SOIL_save_image( "\\showme.bmp", SOIL_SAVE_TYPE_BMP,
							new_width, new_height, channels,
							resampled );
			*/
			/*	nuke the old guy, then point it at the new guy	*/
			SOIL_free_image_data( img );
			img = resampled;
			width = new_width;
			height = new_height;
		}
	}
	/*	now, if it is too large...	*/
	if( (width > max_supported_size) || (height > max_supported_size) )
	{
		/*	I've already made it a power of two, so simply use the MIPmapping
			code to reduce its size to the allowable maximum.	*/
		unsigned char *resampled;
		int reduce_block_x = 1, reduce_block_y = 1;
		int new_width, new_height;
		if( width > max_supported_size )
		{
			reduce_block_x = width / max_supported_size;
		}
		if( height > max_supported_size )
		{
			reduce_block_y = height / max_supported_size;
		}
		new_width = width / reduce_block_x;
		new_height = height / reduce_block_y;
		resampled = (unsigned char*)malloc( channels*new_width*new_height );
		/*	perform the actual reduction	*/
		mipmap_image(	img, width, height, channels,
						resampled, reduce_block_x, reduce_block_y );
		/*	nuke the old guy, then point it at the new guy	*/
		SOIL_free_image_data( img );
		img = resampled;
		width = new_width;
		height = new_height;
	}
	/*	does the user want us to use YCoCg color space?	*/
	if( flags & SOIL_FLAG_CoCg_Y )
	{
		/*	this will only work with RGB and RGBA images */
		convert_RGB_to_YCoCg( img, width, height, channels );
		/*
		save_image_as_DDS( "CoCg_Y.dds", width, height, channels, img );
		*/
	}
	/*	create the OpenGL texture ID handle
    	(note: allowing a forced texture ID lets me reload a texture)	*/
    tex_id = reuse_texture_ID;
    if( tex_id == 0 )
    {
		glGenTextures( 1, &tex_id );
    }
	check_for_GL_errors( "glGenTextures" );
	/* Note: sometimes glGenTextures fails (usually no OpenGL context)	*/
	if( tex_id )
	{
		/*	and what type am I using as the internal texture format?	*/
		switch( channels )
		{
		case 1:
			original_texture_format = GL_LUMINANCE;
			break;
		case 2:
			original_texture_format = GL_LUMINANCE_ALPHA;
			break;
		case 3:
			original_texture_format = GL_RGB;
			break;
		case 4:
			original_texture_format = GL_RGBA;
			break;
		}
		internal_texture_format = original_texture_format;
		/*	does the user want me to, and can I, save as DXT?	*/
		if( flags & SOIL_FLAG_COMPRESS_TO_DXT )
		{
			DXT_mode = query_DXT_capability();
			if( DXT_mode == SOIL_CAPABILITY_PRESENT )
			{
				/*	I can use DXT, whether I compress it or OpenGL does	*/
				if( (channels & 1) == 1 )
				{
					/*	1 or 3 channels = DXT1	*/
					internal_texture_format = SOIL_RGB_S3TC_DXT1;
				} else
				{
					/*	2 or 4 channels = DXT5	*/
					internal_texture_format = SOIL_RGBA_S3TC_DXT5;
				}
			}
		}
		/*  bind an OpenGL texture ID	*/
		glBindTexture( opengl_texture_type, tex_id );
		check_for_GL_errors( "glBindTexture" );
		/*  upload the main image	*/
		if( DXT_mode == SOIL_CAPABILITY_PRESENT )
		{
			/*	user wants me to do the DXT conversion!	*/
			int DDS_size;
			unsigned char *DDS_data = NULL;
			if( (channels & 1) == 1 )
			{
				/*	RGB, use DXT1	*/
				DDS_data = convert_image_to_DXT1( img, width, height, channels, &DDS_size );
			} else
			{
				/*	RGBA, use DXT5	*/
				DDS_data = convert_image_to_DXT5( img, width, height, channels, &DDS_size );
			}
			if( DDS_data )
			{
				soilGlCompressedTexImage2D(
					opengl_texture_target, 0,
					internal_texture_format, width, height, 0,
					DDS_size, DDS_data );
				check_for_GL_errors( "glCompressedTexImage2D" );
				SOIL_free_image_data( DDS_data );
				/*	printf( "Internal DXT compressor\n" );	*/
			} else
			{
				/*	my compression failed, try the OpenGL driver's version	*/
				glTexImage2D(
					opengl_texture_target, 0,
					internal_texture_format, width, height, 0,
					original_texture_format, GL_UNSIGNED_BYTE, img );
				check_for_GL_errors( "glTexImage2D" );
				/*	printf( "OpenGL DXT compressor\n" );	*/
			}
		} else
		{
			/*	user want OpenGL to do all the work!	*/
			glTexImage2D(
				opengl_texture_target, 0,
				internal_texture_format, width, height, 0,
				original_texture_format, GL_UNSIGNED_BYTE, img );
			check_for_GL_errors( "glTexImage2D" );
			/*printf( "OpenGL DXT compressor\n" );	*/
		}
		/*	are any MIPmaps desired?	*/
		if( flags & SOIL_FLAG_MIPMAPS )
		{
			int MIPlevel = 1;
			int MIPwidth = (width+1) / 2;
			int MIPheight = (height+1) / 2;
			unsigned char *resampled = (unsigned char*)malloc( channels*MIPwidth*MIPheight );
			while( ((1<<MIPlevel) <= width) || ((1<<MIPlevel) <= height) )
			{
				/*	do this MIPmap level	*/
				mipmap_image(
						img, width, height, channels,
						resampled,
						(1 << MIPlevel), (1 << MIPlevel) );
				/*  upload the MIPmaps	*/
				if( DXT_mode == SOIL_CAPABILITY_PRESENT )
				{
					/*	user wants me to do the DXT conversion!	*/
					int DDS_size;
					unsigned char *DDS_data = NULL;
					if( (channels & 1) == 1 )
					{
						/*	RGB, use DXT1	*/
						DDS_data = convert_image_to_DXT1(
								resampled, MIPwidth, MIPheight, channels, &DDS_size );
					} else
					{
						/*	RGBA, use DXT5	*/
						DDS_data = convert_image_to_DXT5(
								resampled, MIPwidth, MIPheight, channels, &DDS_size );
					}
					if( DDS_data )
					{
						soilGlCompressedTexImage2D(
							opengl_texture_target, MIPlevel,
							internal_texture_format, MIPwidth, MIPheight, 0,
							DDS_size, DDS_data );
						check_for_GL_errors( "glCompressedTexImage2D" );
						SOIL_free_image_data( DDS_data );
					} else
					{
						/*	my compression failed, try the OpenGL driver's version	*/
						glTexImage2D(
							opengl_texture_target, MIPlevel,
							internal_texture_format, MIPwidth, MIPheight, 0,
							original_texture_format, GL_UNSIGNED_BYTE, resampled );
						check_for_GL_errors( "glTexImage2D" );
					}
				} else
				{
					/*	user want OpenGL to do all the work!	*/
					glTexImage2D(
						opengl_texture_target, MIPlevel,
						internal_texture_format, MIPwidth, MIPheight, 0,
						original_texture_format, GL_UNSIGNED_BYTE, resampled );
					check_for_GL_errors( "glTexImage2D" );
				}
				/*	prep for the next level	*/
				++MIPlevel;
				MIPwidth = (MIPwidth + 1) / 2;
				MIPheight = (MIPheight + 1) / 2;
			}
			SOIL_free_image_data( resampled );
			/*	instruct OpenGL to use the MIPmaps	*/
			glTexParameteri( opengl_texture_type, GL_TEXTURE_MAG_FILTER, GL_LINEAR );
			glTexParameteri( opengl_texture_type, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR );
			check_for_GL_errors( "GL_TEXTURE_MIN/MAG_FILTER" );
		} else
		{
			/*	instruct OpenGL _NOT_ to use the MIPmaps	*/
			glTexParameteri( opengl_texture_type, GL_TEXTURE_MAG_FILTER, GL_LINEAR );
			glTexParameteri( opengl_texture_type, GL_TEXTURE_MIN_FILTER, GL_LINEAR );
			check_for_GL_errors( "GL_TEXTURE_MIN/MAG_FILTER" );
		}
		/*	does the user want clamping, or wrapping?	*/
		if( flags & SOIL_FLAG_TEXTURE_REPEATS )
		{
			glTexParameteri( opengl_texture_type, GL_TEXTURE_WRAP_S, GL_REPEAT );
			glTexParameteri( opengl_texture_type, GL_TEXTURE_WRAP_T, GL_REPEAT );
			if( opengl_texture_type == SOIL_TEXTURE_CUBE_MAP )
			{
				/*	SOIL_TEXTURE_WRAP_R is invalid if cubemaps aren't supported	*/
				glTexParameteri( opengl_texture_type, SOIL_TEXTURE_WRAP_R, GL_REPEAT );
			}
			check_for_GL_errors( "GL_TEXTURE_WRAP_*" );
		} else
		{
			/*	unsigned int clamp_mode = SOIL_CLAMP_TO_EDGE;	*/
			unsigned int clamp_mode = GL_CLAMP;
			glTexParameteri( opengl_texture_type, GL_TEXTURE_WRAP_S, clamp_mode );
			glTexParameteri( opengl_texture_type, GL_TEXTURE_WRAP_T, clamp_mode );
			if( opengl_texture_type == SOIL_TEXTURE_CUBE_MAP )
			{
				/*	SOIL_TEXTURE_WRAP_R is invalid if cubemaps aren't supported	*/
				glTexParameteri( opengl_texture_type, SOIL_TEXTURE_WRAP_R, clamp_mode );
			}
			check_for_GL_errors( "GL_TEXTURE_WRAP_*" );
		}
		/*	done	*/
		result_string_pointer = "Image loaded as an OpenGL texture";
	} else
	{
		/*	failed	*/
		result_string_pointer = "Failed to generate an OpenGL texture name; missing OpenGL context?";
	}
	SOIL_free_image_data( img );
	return tex_id;
}